

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  undefined8 *in_FS_OFFSET;
  
  pRVar4 = this->m_recycler;
  if (pRVar4->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1b,"(!m_recycler.isHeapEnumInProgress)",
                       "!m_recycler.isHeapEnumInProgress");
    if (!bVar3) goto LAB_00292228;
    *puVar1 = 0;
    pRVar4 = this->m_recycler;
  }
  if (pRVar4->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1c,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar3) {
LAB_00292228:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    pRVar4 = this->m_recycler;
  }
  EnsureNotCollecting(pRVar4);
  DoCommonSetup(this);
  Recycler::ResetMarks(this->m_recycler,ResetMarkFlags_HeapEnumeration);
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->m_recycler->collectionState,CollectionStateNotCollecting);
  pRVar4 = this->m_recycler;
  pRVar4->isHeapEnumInProgress = true;
  pRVar4->isCollectionDisabled = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration()
{
    Assert(!m_recycler.isHeapEnumInProgress);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
    m_recycler.EnsureNotCollecting();
    DoCommonSetup();
    m_recycler.ResetMarks(ResetMarkFlags_HeapEnumeration);
    m_recycler.SetCollectionState(CollectionStateNotCollecting);
    m_recycler.isHeapEnumInProgress = true;
    m_recycler.isCollectionDisabled = true;
}